

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricGroupCloseExp(zet_metric_group_handle_t hMetricGroup)

{
  zet_pfnMetricGroupCloseExp_t pfnCloseExp;
  ze_result_t result;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnCloseExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8d8 != (code *)0x0) {
    pfnCloseExp._4_4_ = (*DAT_0011c8d8)(hMetricGroup);
  }
  return pfnCloseExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCloseExp(
        zet_metric_group_handle_t hMetricGroup          ///< [in] Handle of the metric group
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCloseExp = context.zetDdiTable.MetricGroupExp.pfnCloseExp;
        if( nullptr != pfnCloseExp )
        {
            result = pfnCloseExp( hMetricGroup );
        }
        else
        {
            // generic implementation
        }

        return result;
    }